

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O0

int Abc_NpnTest(char *pFileName,int NpnType,int nVarNum,int fDumpRes,int fBinary,int fVerbose)

{
  int fVerbose_local;
  int fBinary_local;
  int fDumpRes_local;
  int nVarNum_local;
  int NpnType_local;
  char *pFileName_local;
  
  if (fVerbose != 0) {
    printf("Using truth tables from file \"%s\"...\n",pFileName);
  }
  if ((NpnType < 0) || (0xb < NpnType)) {
    printf("Unknown canonical form value (%d).\n",(ulong)(uint)NpnType);
  }
  else {
    Abc_TruthNpnTest(pFileName,NpnType,nVarNum,fDumpRes,fBinary,fVerbose);
  }
  fflush(_stdout);
  return 0;
}

Assistant:

int Abc_NpnTest( char * pFileName, int NpnType, int nVarNum, int fDumpRes, int fBinary, int fVerbose )
{
    if ( fVerbose )
        printf( "Using truth tables from file \"%s\"...\n", pFileName );
    if ( NpnType >= 0 && NpnType <= 11 )
        Abc_TruthNpnTest( pFileName, NpnType, nVarNum, fDumpRes, fBinary, fVerbose );
    else
        printf( "Unknown canonical form value (%d).\n", NpnType );
    fflush( stdout );
    return 0;
}